

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O2

void rgbaInterfaceTiledExamples(void)

{
  ostream *poVar1;
  int w;
  int local_24;
  Array2D<Imf_3_2::Rgba> pixels;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\nRGBA tiled images\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  w = 600;
  poVar1 = std::operator<<((ostream *)&std::cout,"writing tiled image with image-size framebuffer");
  std::endl<char,std::char_traits<char>>(poVar1);
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D(&pixels,400,600);
  drawImage3(&pixels,600,400,0,600,0,400,0,0);
  writeTiledRgbaONE1("tiledrgba1.exr",pixels._data,600,400,100,0x4b);
  poVar1 = std::operator<<((ostream *)&std::cout,"writing tiled image with tile-size framebuffer");
  std::endl<char,std::char_traits<char>>(poVar1);
  writeTiledRgbaONE2("tiledrgba2.exr",600,400,100,0x4b);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "writing tiled mipmap image with image-size framebuffer");
  std::endl<char,std::char_traits<char>>(poVar1);
  writeTiledRgbaMIP1("tiledrgba3.exr",0x200,0x200,100,0x4b);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "writing tiled mipmap image with tile-size framebuffer");
  std::endl<char,std::char_traits<char>>(poVar1);
  writeTiledRgbaMIP2("tiledrgba4.exr",0x200,0x200,100,0x4b);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "writing tiled ripmap image with image-size framebuffer");
  std::endl<char,std::char_traits<char>>(poVar1);
  writeTiledRgbaRIP1("tiledrgba5.exr",0x100,0x100,100,0x4b);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "writing tiled ripmap image with tile-size framebuffer");
  std::endl<char,std::char_traits<char>>(poVar1);
  writeTiledRgbaRIP2("tiledrgba6.exr",0x100,0x100,100,0x4b);
  poVar1 = std::operator<<((ostream *)&std::cout,"reading tiled rgba file");
  std::endl<char,std::char_traits<char>>(poVar1);
  readTiledRgba1("tiledrgba1.exr",&pixels,&w,&local_24);
  Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(&pixels);
  return;
}

Assistant:

void
rgbaInterfaceTiledExamples ()
{
    cout << "\nRGBA tiled images\n" << endl;

    const int tw = 100;
    const int th = 75;
    int       w  = 600;
    int       h  = 400;

    cout << "writing tiled image with image-size framebuffer" << endl;

    Array2D<Rgba> pixels (h, w);
    drawImage3 (pixels, w, h, 0, w, 0, h, 0);
    writeTiledRgbaONE1 ("tiledrgba1.exr", &pixels[0][0], w, h, tw, th);

    cout << "writing tiled image with tile-size framebuffer" << endl;

    writeTiledRgbaONE2 ("tiledrgba2.exr", w, h, tw, th);

    cout << "writing tiled mipmap image with image-size framebuffer" << endl;

    writeTiledRgbaMIP1 ("tiledrgba3.exr", 512, 512, tw, th);

    cout << "writing tiled mipmap image with tile-size framebuffer" << endl;

    writeTiledRgbaMIP2 ("tiledrgba4.exr", 512, 512, tw, th);

    cout << "writing tiled ripmap image with image-size framebuffer" << endl;

    writeTiledRgbaRIP1 ("tiledrgba5.exr", 256, 256, tw, th);

    cout << "writing tiled ripmap image with tile-size framebuffer" << endl;

    writeTiledRgbaRIP2 ("tiledrgba6.exr", 256, 256, tw, th);

    cout << "reading tiled rgba file" << endl;

    readTiledRgba1 ("tiledrgba1.exr", pixels, w, h);
}